

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O1

xmlChar * xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal,xmlChar *URI)

{
  uint uVar1;
  char *pcVar2;
  int iVar3;
  uint len;
  int iVar4;
  int iVar5;
  xmlChar *pxVar6;
  xmlChar *pxVar7;
  _xmlCatalogEntry *p_Var8;
  xmlCatalogEntryPtr catal_00;
  _xmlCatalogEntry *catal_01;
  ulong uVar9;
  ulong uVar10;
  xmlCatalogEntryPtr local_1d8;
  undefined8 auStack_1c8 [51];
  
  if (catal != (xmlCatalogEntryPtr)0x0) {
    iVar3 = xmlStrncmp(URI,(xmlChar *)"urn:publicid:",0xd);
    if (iVar3 == 0) {
      pxVar6 = xmlCatalogUnWrapURN(URI);
      if (xmlDebugCatalogs != 0) {
        if (pxVar6 == (xmlChar *)0x0) {
          pcVar2 = "Public URN ID %s expanded to NULL\n";
        }
        else {
          pcVar2 = "Public URN ID expanded to %s\n";
          URI = pxVar6;
        }
        xmlCatalogPrintDebug(pcVar2 + 7,URI);
      }
      pxVar7 = xmlCatalogListXMLResolve(catal,pxVar6,(xmlChar *)0x0);
      if (pxVar6 == (xmlChar *)0x0) {
        return pxVar7;
      }
      (*xmlFree)(pxVar6);
      return pxVar7;
    }
    do {
      if (catal->type == XML_CATA_CATALOG) {
        if (catal->children == (_xmlCatalogEntry *)0x0) {
          xmlFetchXMLCatalogFile(catal);
        }
        catal_01 = catal->children;
        if (catal_01 != (xmlCatalogEntryPtr)0x0) {
          if (catal_01->depth < 0x33) {
            uVar1 = 0;
            local_1d8 = (xmlCatalogEntryPtr)0x0;
            iVar5 = 0;
            iVar3 = 0;
            p_Var8 = catal_01;
            do {
              switch(p_Var8->type) {
              case XML_CATA_NEXT_CATALOG:
                iVar5 = iVar5 + 1;
                break;
              case XML_CATA_URI:
                iVar4 = xmlStrEqual(URI,p_Var8->name);
                if (iVar4 != 0) {
                  if (xmlDebugCatalogs != 0) {
                    xmlCatalogPrintDebug("Found URI match %s\n");
                  }
                  pxVar6 = xmlStrdup(p_Var8->URL);
                  goto LAB_00162a6e;
                }
                break;
              case XML_CATA_REWRITE_URI:
                len = xmlStrlen(p_Var8->name);
                if (((int)uVar1 < (int)len) &&
                   (iVar4 = xmlStrncmp(URI,p_Var8->name,len), iVar4 == 0)) {
                  local_1d8 = p_Var8;
                  uVar1 = len;
                }
                break;
              case XML_CATA_DELEGATE_URI:
                pxVar6 = p_Var8->name;
                iVar4 = xmlStrlen(pxVar6);
                iVar4 = xmlStrncmp(URI,pxVar6,iVar4);
                iVar3 = iVar3 + (uint)(iVar4 == 0);
              }
              p_Var8 = p_Var8->next;
            } while (p_Var8 != (_xmlCatalogEntry *)0x0);
            if (local_1d8 == (xmlCatalogEntryPtr)0x0) {
              if (iVar3 == 0) {
                if (iVar5 == 0) goto LAB_00162818;
                do {
                  if (catal_01->type == XML_CATA_NEXT_CATALOG) {
                    if (catal_01->children == (_xmlCatalogEntry *)0x0) {
                      xmlFetchXMLCatalogFile(catal_01);
                    }
                    if ((catal_01->children != (xmlCatalogEntryPtr)0x0) &&
                       (pxVar6 = xmlCatalogListXMLResolveURI(catal_01->children,URI),
                       pxVar6 != (xmlChar *)0x0)) break;
                  }
                  catal_01 = catal_01->next;
                  pxVar6 = (xmlChar *)0x0;
                } while (catal_01 != (_xmlCatalogEntry *)0x0);
              }
              else {
                uVar10 = 0;
                do {
                  iVar3 = (int)uVar10;
                  p_Var8 = catal_01;
                  while( true ) {
                    if ((p_Var8->type != XML_CATA_DELEGATE_URI) &&
                       (p_Var8->type != XML_CATA_DELEGATE_SYSTEM)) goto LAB_00162a25;
                    pxVar6 = p_Var8->name;
                    iVar5 = xmlStrlen(pxVar6);
                    iVar5 = xmlStrncmp(URI,pxVar6,iVar5);
                    if (iVar5 != 0) goto LAB_00162a25;
                    catal_00 = catal_01;
                    if (iVar3 < 1) break;
                    uVar9 = 0;
                    while (iVar5 = xmlStrEqual(p_Var8->URL,(xmlChar *)auStack_1c8[uVar9]),
                          iVar5 == 0) {
                      uVar9 = uVar9 + 1;
                      catal_00 = p_Var8;
                      if (uVar10 == uVar9) goto LAB_001629c7;
                    }
                    p_Var8 = p_Var8->next;
                    if (p_Var8 == (_xmlCatalogEntry *)0x0) goto LAB_00162a62;
                  }
LAB_001629c7:
                  if (iVar3 < 0x32) {
                    uVar10 = (ulong)(iVar3 + 1);
                    auStack_1c8[iVar3] = catal_00->URL;
                  }
                  if (catal_00->children == (_xmlCatalogEntry *)0x0) {
                    xmlFetchXMLCatalogFile(catal_00);
                  }
                  p_Var8 = catal_00;
                  if (catal_00->children != (_xmlCatalogEntry *)0x0) {
                    if (xmlDebugCatalogs != 0) {
                      xmlCatalogPrintDebug("Trying URI delegate %s\n",catal_00->URL);
                    }
                    pxVar6 = xmlCatalogListXMLResolveURI(catal_00->children,URI);
                    if (pxVar6 != (xmlChar *)0x0) goto LAB_00162a6e;
                  }
LAB_00162a25:
                  catal_01 = p_Var8->next;
                } while (catal_01 != (_xmlCatalogEntry *)0x0);
LAB_00162a62:
                pxVar6 = (xmlChar *)0xffffffffffffffff;
              }
            }
            else {
              if (xmlDebugCatalogs != 0) {
                xmlCatalogPrintDebug("Using rewriting rule %s\n");
              }
              pxVar6 = xmlStrdup(local_1d8->URL);
              if (pxVar6 == (xmlChar *)0x0) goto LAB_00162818;
              pxVar6 = xmlStrcat(pxVar6,URI + uVar1);
            }
          }
          else {
            xmlCatalogErr(catal_01,(xmlNodePtr)0x0,0x676,"Detected recursion in catalog %s\n",
                          catal_01->name,(xmlChar *)0x0,(xmlChar *)0x0);
LAB_00162818:
            pxVar6 = (xmlChar *)0x0;
          }
LAB_00162a6e:
          if (pxVar6 != (xmlChar *)0x0) {
            return pxVar6;
          }
        }
      }
      catal = catal->next;
    } while (catal != (_xmlCatalogEntry *)0x0);
  }
  return (xmlChar *)0x0;
}

Assistant:

static xmlChar *
xmlCatalogListXMLResolveURI(xmlCatalogEntryPtr catal, const xmlChar *URI) {
    xmlChar *ret = NULL;
    xmlChar *urnID = NULL;

    if (catal == NULL)
        return(NULL);
    if (URI == NULL)
	return(NULL);

    if (!xmlStrncmp(URI, BAD_CAST XML_URN_PUBID, sizeof(XML_URN_PUBID) - 1)) {
	urnID = xmlCatalogUnWrapURN(URI);
	if (xmlDebugCatalogs) {
	    if (urnID == NULL)
		xmlCatalogPrintDebug(
			"URN ID %s expanded to NULL\n", URI);
	    else
		xmlCatalogPrintDebug(
			"URN ID expanded to %s\n", urnID);
	}
	ret = xmlCatalogListXMLResolve(catal, urnID, NULL);
	if (urnID != NULL)
	    xmlFree(urnID);
	return(ret);
    }
    while (catal != NULL) {
	if (catal->type == XML_CATA_CATALOG) {
	    if (catal->children == NULL) {
		xmlFetchXMLCatalogFile(catal);
	    }
	    if (catal->children != NULL) {
		ret = xmlCatalogXMLResolveURI(catal->children, URI);
		if (ret != NULL)
		    return(ret);
	    }
	}
	catal = catal->next;
    }
    return(ret);
}